

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O1

void __thiscall BehaviourTree::Succeed::~Succeed(Succeed *this)

{
  pointer pcVar1;
  
  (this->super_DecoratorNode).super_Node._vptr_Node = (_func_int **)&PTR__DecoratorNode_0010f5d8;
  if ((this->super_DecoratorNode).child != (Node *)0x0) {
    (this->super_DecoratorNode).child = (Node *)0x0;
  }
  (this->super_DecoratorNode).super_Node._vptr_Node = (_func_int **)&PTR__Node_0010f600;
  pcVar1 = (this->super_DecoratorNode).super_Node._name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_DecoratorNode).super_Node._name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual Status run() override {
			Node* child = getChild();
			if (child->dontSkip()) {
				// run at each and every iteration
				const Status s = child->run();
				_lastStatus = s;
				if (s == Status::ERROR || s == Status::RUNNING)
					return s;
			}
			else {
				// if the job has already done, return the status
				// else execute it
				Status s;
				if (child->isCompleted()) {
					s = child->getLastStatus();
				}
				else {
					s = child->run();
					_lastStatus = s;
					if (s != Status::RUNNING)
						_completed = true;
				}
				if (s == Status::ERROR || s == Status::RUNNING)
					return s;
			}
			return Status::SUCCESS;
		}